

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory_systemv.cpp
# Opt level: O0

bool __thiscall
QSharedMemorySystemV::create(QSharedMemorySystemV *this,QSharedMemoryPrivate *self,qsizetype size)

{
  QChar fillChar;
  QChar fillChar_00;
  int iVar1;
  key_t kVar2;
  char *pcVar3;
  int *piVar4;
  QSharedMemoryPrivate *in_RDX;
  QLatin1String *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView in_stack_00000050;
  int built;
  bool createdFile;
  QLatin1StringView function;
  undefined4 in_stack_fffffffffffffeb8;
  SharedMemoryError in_stack_fffffffffffffebc;
  QSharedMemoryPrivate *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  QLatin1String *in_stack_fffffffffffffed0;
  QLatin1String *a;
  QNativeIpcKey *in_stack_fffffffffffffed8;
  QString *this_00;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined2 in_stack_ffffffffffffff1c;
  undefined1 in_stack_ffffffffffffff1e;
  byte bVar5;
  bool local_c1;
  QChar local_aa;
  QLatin1StringView local_a8;
  QString local_98 [2];
  QLatin1StringView local_68;
  QChar local_4a;
  QLatin1StringView local_48;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = 0;
  updateNativeKeyFile((QSharedMemorySystemV *)
                      CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                      in_stack_fffffffffffffed8);
  iVar1 = QtIpcCommon::createUnixKeyFile
                    ((QByteArray *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  if (iVar1 == -1) {
    QSharedMemory::tr((char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                      (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
    local_48 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                          (size_t)in_stack_fffffffffffffec0);
    QChar::QChar<char16_t,_true>(&local_4a,L' ');
    fillChar.ucs._1_1_ = bVar5;
    fillChar.ucs._0_1_ = in_stack_ffffffffffffff1e;
    QString::arg<QLatin1String,_true>
              ((QString *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
               in_stack_fffffffffffffecc,fillChar);
    QSharedMemoryPrivate::setError
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,(QString *)0x8d3c47);
    QString::~QString((QString *)0x8d3c56);
    QString::~QString((QString *)0x8d3c63);
    local_c1 = false;
  }
  else {
    if (iVar1 == 1) {
      bVar5 = 1;
    }
    kVar2 = handle((QSharedMemorySystemV *)in_RDX,
                   (QSharedMemoryPrivate *)
                   CONCAT17(bVar5,CONCAT16(in_stack_ffffffffffffff1e,
                                           CONCAT24(in_stack_ffffffffffffff1c,iVar1))));
    if (kVar2 == 0) {
      if ((bVar5 & 1) != 0) {
        pcVar3 = QByteArray::operator_cast_to_char_((QByteArray *)0x8d3ce6);
        unlink(pcVar3);
      }
      local_c1 = false;
    }
    else {
      iVar1 = shmget(*(key_t *)(in_RDI + 0x18),(size_t)in_RDX,0x780);
      if (iVar1 == -1) {
        local_68.m_data = &DAT_aaaaaaaaaaaaaaaa;
        local_68.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_68 = Qt::Literals::StringLiterals::operator____L1
                             ((char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                              (size_t)in_stack_fffffffffffffec0);
        piVar4 = __errno_location();
        if (*piVar4 == 0x16) {
          this_00 = local_98;
          a = in_RSI;
          QSharedMemory::tr((char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                            (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
          local_a8 = Qt::Literals::StringLiterals::operator____L1
                               ((char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8
                                                ),(size_t)in_stack_fffffffffffffec0);
          QChar::QChar<char16_t,_true>(&local_aa,L' ');
          fillChar_00.ucs._1_1_ = bVar5;
          fillChar_00.ucs._0_1_ = in_stack_ffffffffffffff1e;
          QString::arg<QLatin1String,_true>(this_00,a,in_stack_fffffffffffffecc,fillChar_00);
          QSharedMemoryPrivate::setError
                    (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,(QString *)0x8d3e06);
          QString::~QString((QString *)0x8d3e15);
          QString::~QString((QString *)0x8d3e22);
        }
        else {
          QSharedMemoryPrivate::setUnixErrorString(in_RDX,in_stack_00000050);
        }
        if (((bVar5 & 1) != 0) && (*(int *)((long)&in_RSI[0xd].m_size + 4) != 4)) {
          pcVar3 = QByteArray::operator_cast_to_char_((QByteArray *)0x8d3ec2);
          unlink(pcVar3);
        }
        local_c1 = false;
      }
      else {
        local_c1 = true;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_c1;
  }
  __stack_chk_fail();
}

Assistant:

bool QSharedMemorySystemV::create(QSharedMemoryPrivate *self, qsizetype size)
{
    // build file if needed
    bool createdFile = false;
    updateNativeKeyFile(self->nativeKey);
    int built = createUnixKeyFile(nativeKeyFile);
    if (built == -1) {
        self->setError(QSharedMemory::KeyError,
                       QSharedMemory::tr("%1: unable to make key")
                       .arg("QSharedMemory::handle:"_L1));
        return false;
    }
    if (built == 1) {
        createdFile = true;
    }

    // get handle
    if (!handle(self)) {
        if (createdFile)
            unlink(nativeKeyFile);
        return false;
    }

    // create
    if (-1 == shmget(unix_key, size_t(size), 0600 | IPC_CREAT | IPC_EXCL)) {
        const auto function = "QSharedMemory::create"_L1;
        switch (errno) {
        case EINVAL:
            self->setError(QSharedMemory::InvalidSize,
                           QSharedMemory::tr("%1: system-imposed size restrictions")
                           .arg("QSharedMemory::handle"_L1));
            break;
        default:
            self->setUnixErrorString(function);
        }
        if (createdFile && self->error != QSharedMemory::AlreadyExists)
            unlink(nativeKeyFile);
        return false;
    }

    return true;
}